

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefRepeatedEnum
          (ExtensionSet *this,int number,int index)

{
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  LogMessage *pLVar1;
  CppType *v1_00;
  CppType *v2_00;
  const_reference piVar2;
  undefined1 auVar3 [16];
  LogMessageFatal local_c0 [23];
  Voidify local_a9;
  CppType local_a8;
  CppType local_a4;
  string *local_a0;
  undefined1 local_98 [16];
  LogMessageFatal local_88 [23];
  Voidify local_71;
  anon_enum_32 local_70;
  anon_enum_32 local_6c;
  string *local_68;
  string *absl_log_internal_check_op_result;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  Extension *local_20;
  Extension *extension;
  int index_local;
  int number_local;
  ExtensionSet *this_local;
  
  extension._0_4_ = index;
  extension._4_4_ = number;
  _index_local = this;
  local_20 = FindOrNull(this,number);
  local_49 = 0;
  if (local_20 == (Extension *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1ff,local_48._M_len,local_48._M_str);
    local_49 = 1;
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  local_6c = (anon_enum_32)((local_20->is_repeated & 1U) == 0);
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_6c);
  local_70 = REPEATED_FIELD;
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_70);
  local_68 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                       (v1,v2,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  if (local_68 != (string *)0x0) {
    local_98 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x200,local_98._0_8_,local_98._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_88);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_71,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
  }
  local_a4 = anon_unknown_58::cpp_type(local_20->type);
  v1_00 = absl::lts_20240722::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a4);
  local_a8 = CPPTYPE_ENUM;
  v2_00 = absl::lts_20240722::log_internal::
          GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a8);
  local_a0 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                       (v1_00,v2_00,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
  if (local_a0 != (string *)0x0) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x200,auVar3._0_8_,auVar3._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_c0);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_a9,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_c0);
  }
  piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)local_20->field_0,(int)extension);
  return piVar2;
}

Assistant:

const int& ExtensionSet::GetRefRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->ptr.repeated_enum_value->Get(index);
}